

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

Bool CopyAttrs(TidyDocImpl *doc,Node *node,Node *child)

{
  AttVal *pAVar1;
  TidyAttrId local_40;
  AttVal *pAStack_38;
  TidyAttrId id;
  AttVal *av2;
  AttVal *av1;
  Node *child_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  pAVar1 = prvTidyAttrGetById(child,TidyAttr_ID);
  if ((pAVar1 != (AttVal *)0x0) &&
     (pAVar1 = prvTidyAttrGetById(node,TidyAttr_ID), pAVar1 != (AttVal *)0x0)) {
    return no;
  }
  pAStack_38 = child->attributes;
  while (pAStack_38 != (AttVal *)0x0) {
    if ((((pAStack_38 == (AttVal *)0x0) || (pAStack_38->dict == (Attribute *)0x0)) ||
        (pAStack_38->dict->id != TidyAttr_STYLE)) &&
       (((pAStack_38 == (AttVal *)0x0 || (pAStack_38->dict == (Attribute *)0x0)) ||
        (pAStack_38->dict->id != TidyAttr_CLASS)))) {
      if ((pAStack_38 == (AttVal *)0x0) || (pAStack_38->dict == (Attribute *)0x0)) {
        local_40 = TidyAttr_UNKNOWN;
      }
      else {
        local_40 = pAStack_38->dict->id;
      }
      if ((local_40 != TidyAttr_UNKNOWN) &&
         (pAVar1 = prvTidyAttrGetById(node,local_40), pAVar1 != (AttVal *)0x0)) {
        prvTidyRemoveAttribute(doc,node,pAVar1);
      }
      prvTidyDetachAttribute(child,pAStack_38);
      pAVar1 = pAStack_38->next;
      pAStack_38->next = (AttVal *)0x0;
      prvTidyInsertAttributeAtEnd(node,pAStack_38);
      pAStack_38 = pAVar1;
    }
    else {
      pAStack_38 = pAStack_38->next;
    }
  }
  return yes;
}

Assistant:

static Bool CopyAttrs( TidyDocImpl* doc, Node *node, Node *child)
{
    AttVal *av1, *av2;
    TidyAttrId id;

    /* Detect attributes that cannot be merged or overwritten. */
    if (TY_(AttrGetById)(child, TidyAttr_ID) != NULL
        && TY_(AttrGetById)(node, TidyAttr_ID) != NULL)
        return no;

    /* Move child attributes to node. Attributes in node
     can be overwritten or merged. */
    for (av2 = child->attributes; av2; )
    {
        /* Dealt by MergeStyles. */
        if (attrIsSTYLE(av2) || attrIsCLASS(av2))
        {
            av2 = av2->next;
            continue;
        }
        /* Avoid duplicates in node */
        if ((id=AttrId(av2)) != TidyAttr_UNKNOWN
            && (av1=TY_(AttrGetById)(node, id))!= NULL)
            TY_(RemoveAttribute)( doc, node, av1 );

        /* Move attribute from child to node */
        TY_(DetachAttribute)( child, av2 );
        av1 = av2;
        av2 = av2->next;
        av1->next = NULL;
        TY_(InsertAttributeAtEnd)( node, av1 );
    }

    return yes;
}